

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

Spectrum __thiscall CMU462::PathTracer::raytrace_pixel(PathTracer *this,size_t x,size_t y)

{
  size_t sVar1;
  size_t sVar2;
  float fVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  float fVar10;
  undefined4 uVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar15;
  undefined4 uVar17;
  undefined1 auVar16 [16];
  undefined4 uVar19;
  undefined1 auVar18 [16];
  Spectrum SVar20;
  undefined8 local_f8;
  Ray local_88;
  undefined4 uVar14;
  
  iVar4 = (int)this->ns_aa;
  sVar1 = (this->sampleBuffer).w;
  sVar2 = (this->sampleBuffer).h;
  uVar13 = (undefined4)(x >> 0x20);
  uVar14 = (undefined4)(sVar1 >> 0x20);
  uVar19 = (undefined4)(y >> 0x20);
  uVar17 = (undefined4)(sVar2 >> 0x20);
  if (iVar4 == 1) {
    auVar11._8_4_ = uVar13;
    auVar11._0_8_ = x;
    auVar11._12_4_ = 0x45300000;
    auVar12._8_4_ = uVar14;
    auVar12._0_8_ = sVar1;
    auVar12._12_4_ = 0x45300000;
    auVar18._8_4_ = uVar19;
    auVar18._0_8_ = y;
    auVar18._12_4_ = 0x45300000;
    auVar16._8_4_ = uVar17;
    auVar16._0_8_ = sVar2;
    auVar16._12_4_ = 0x45300000;
    Camera::generate_ray
              (&local_88,this->camera,
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)x) - 4503599627370496.0) + 0.5) /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) + -0.5,
               ((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)y) - 4503599627370496.0) + 0.5) /
               ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) + -0.5);
    SVar20 = trace_ray(this,&local_88);
  }
  else if (iVar4 < 1) {
    SVar20 = (Spectrum)ZEXT812(0);
  }
  else {
    auVar5._8_4_ = uVar13;
    auVar5._0_8_ = x;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = uVar14;
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = uVar19;
    auVar7._0_8_ = y;
    auVar7._12_4_ = 0x45300000;
    auVar8._8_4_ = uVar17;
    auVar8._0_8_ = sVar2;
    auVar8._12_4_ = 0x45300000;
    fVar3 = 1.0 / (float)iVar4;
    fVar15 = 0.0;
    local_f8 = 0;
    do {
      (*this->gridSampler->_vptr_Sampler2D[2])(&local_88);
      Camera::generate_ray
                (&local_88,this->camera,
                 ((double)local_88.depth +
                 (auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)x) - 4503599627370496.0)) /
                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) + -0.5,
                 (local_88.o.x +
                 (auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)y) - 4503599627370496.0)) /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) + -0.5);
      SVar20 = trace_ray(this,&local_88);
      fVar10 = SVar20.b;
      auVar9._0_8_ = SVar20._0_8_;
      auVar9._8_8_ = extraout_XMM0_Qb;
      if (fVar10 <= 0.0) {
        fVar10 = 0.0;
      }
      if (10.0 <= fVar10) {
        fVar10 = 10.0;
      }
      fVar15 = fVar15 + fVar10 * fVar3;
      auVar9 = maxps(auVar9,_DAT_001ed040);
      auVar9 = minps(auVar9,_DAT_001eebd0);
      local_f8._4_4_ = (float)((ulong)local_f8 >> 0x20);
      local_f8._0_4_ = (float)local_f8 + auVar9._0_4_ * fVar3;
      local_f8._4_4_ = local_f8._4_4_ + auVar9._4_4_ * fVar3;
      SVar20.b = fVar15;
      SVar20.r = (float)local_f8;
      SVar20.g = local_f8._4_4_;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return SVar20;
}

Assistant:

Spectrum PathTracer::raytrace_pixel(size_t x, size_t y) {
	// TODO (PathTracer):
	// Sample the pixel with coordinate (x,y) and return the result spectrum.
	// The sample rate is given by the number of camera rays per pixel.

	int num_samples = ns_aa;

	size_t w = sampleBuffer.w;
	size_t h = sampleBuffer.h;

	if (num_samples == 1) {
		Vector2D p = Vector2D((double(x)+0.5) / w, (double(y)+0.5) / h);
		return trace_ray(camera->generate_ray(p.x-0.5, p.y-0.5));
	}
	else {
		Vector2D p;
		double a1, a2;
		Spectrum result(0, 0, 0);
		Spectrum temp;
		for (int i = 0; i < num_samples; i++) {
			p = gridSampler->get_sample();
			a1 = (double(x) + p.x) / w;
			a2 = (double(y) + p.y) / h;
			temp = trace_ray(camera->generate_ray(a1 - 0.5, a2 - 0.5));
			temp.clampRGB(10.0);
			result += temp * (1.0 / num_samples);
		}
		return result;
	}
}